

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

_Bool cmdq_pop(cmd_context c)

{
  wchar_t wVar1;
  long lVar2;
  command *local_18;
  command *cmd;
  cmd_context c_local;
  
  if (repeating) {
    lVar2 = (long)((cmd_tail + L'\x13') % 0x14);
  }
  else {
    if (cmd_head == cmd_tail) {
      return false;
    }
    wVar1 = cmd_tail + L'\x01';
    lVar2 = (long)cmd_tail;
    cmd_tail = wVar1;
    if (wVar1 == L'\x14') {
      cmd_tail = L'\0';
    }
  }
  local_18 = cmd_queue + lVar2;
  if (cmd_queue[lVar2].background_command == 0) {
    last_command_idx = (cmd_tail + L'\x13') % 0x14;
  }
  process_command(c,local_18);
  return true;
}

Assistant:

bool cmdq_pop(cmd_context c)
{
	struct command *cmd;

	/* If we're repeating, just pull the last command again. */
	if (repeating) {
		cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];
	} else if (cmd_head != cmd_tail) {
		/* If we have a command ready, set it. */
		cmd = &cmd_queue[cmd_tail++];
		if (cmd_tail == CMD_QUEUE_SIZE)
			cmd_tail = 0;
	} else {
		/* Failure to get a command. */
		return false;
	}

	/* Now process it */
	if (!cmd->background_command) {
		last_command_idx = prev_cmd_idx(cmd_tail);
	}
	process_command(c, cmd);
	return true;
}